

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O0

Cont * __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Pop
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  VariableElement *this_00;
  size_t sVar1;
  VariableElement *element;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this_local;
  
  this_00 = (VariableElement *)
            ContinuousPageStack<1UL>::Pop
                      (&this->super_ContinuousPageStack<1UL>,this->topElementSize);
  if (this_00 == (VariableElement *)0x0) {
    this_local = (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *)0x0;
  }
  else {
    sVar1 = VariableElement::PreviousElementSize(this_00);
    this->topElementSize = sVar1;
    this_local = (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *)
                 VariableElement::Data(this_00);
  }
  return (Cont *)this_local;
}

Assistant:

inline T* ContinuousPageStackOfVariableElements<T, InitialPageCount>::Pop()
{
    VariableElement *const element = reinterpret_cast<VariableElement*>(ContinuousPageStack<InitialPageCount>::Pop(topElementSize));
    if (element == 0)
        return 0;
    else
    {
        topElementSize = element->PreviousElementSize();
        return reinterpret_cast<T*>(element->Data());
    }
}